

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setWindowModified(QWidget *this,bool mod)

{
  long lVar1;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  bool in_stack_00000023;
  undefined3 in_stack_00000024;
  QEvent e;
  undefined1 *local_18;
  QWidgetPrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidget *)0x37fe63);
  setAttribute(this,_in_stack_00000024,in_stack_00000023);
  QWidgetPrivate::setWindowModified_helper(in_stack_fffffffffffffff0);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_18,ModifiedChange);
  QCoreApplication::sendEvent(in_RDI,(QEvent *)&local_18);
  QEvent::~QEvent((QEvent *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setWindowModified(bool mod)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_WindowModified, mod);

    d->setWindowModified_helper();

    QEvent e(QEvent::ModifiedChange);
    QCoreApplication::sendEvent(this, &e);
}